

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub-sub.c
# Opt level: O2

void ps_publish_command(uint8_t service,char *scope,ps_event_t *event)

{
  uint8_t *puVar1;
  uint8_t *name_00;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  pub_topic_t *userdata;
  long lVar5;
  ndn_time_ms_t nVar6;
  size_t sVar7;
  ndn_aes_key_t *pnVar8;
  ndn_name_t *pnVar9;
  ndn_ecc_prv_t *pnVar10;
  pub_topic_t *ppVar11;
  int i;
  int iVar12;
  ulong uVar13;
  name_component_t *component;
  undefined1 local_400 [8];
  ndn_name_t scope_name;
  ndn_name_t name;
  name_component_t tp_comp;
  uint32_t buffer_length;
  uint32_t local_44;
  char *pcStack_40;
  uint32_t used_size;
  uint8_t local_31 [8];
  uint8_t service_local;
  
  pcStack_40 = scope;
  local_31[0] = service;
  if (m_has_initialized == '\0') {
    _ps_topics_init();
  }
  puVar1 = &scope_name.components[9].size;
  ndn_name_init((ndn_name_t *)puVar1);
  register0x00000000 = ndn_key_storage_get_instance();
  ndn_name_append_component((ndn_name_t *)puVar1,(name_component_t *)register0x00000000);
  iVar12 = 1;
  ndn_name_append_bytes_component((ndn_name_t *)puVar1,local_31,1);
  ndn_name_append_string_component((ndn_name_t *)puVar1,"CMD",3);
  userdata = _match_pub_topic(local_31[0],true);
  if (userdata == (pub_topic_t *)0x0) {
    userdata = (pub_topic_t *)0x0;
    for (lVar5 = 0; lVar5 != 0x668; lVar5 = lVar5 + 0x148) {
      ppVar11 = (pub_topic_t *)(m_pub_sub_state.pub_topics[0].cache + lVar5 + -2);
      if (ppVar11->service == 0xff) {
        userdata = ppVar11;
      }
    }
    if (userdata == (pub_topic_t *)0x0) {
      printf("INFO: %s: ","ps_publish_command");
      printf("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      putchar(10);
      iVar3 = -1;
      uVar13 = m_pub_sub_state.pub_topics[0].last_update_tp;
      for (lVar5 = 0; lVar5 != 0x520; lVar5 = lVar5 + 0x148) {
        uVar2 = *(ulong *)((long)&m_pub_sub_state.pub_topics[1].last_update_tp + lVar5);
        if (uVar2 < uVar13) {
          uVar13 = uVar2;
          iVar3 = iVar12;
        }
        iVar12 = iVar12 + 1;
      }
      userdata = m_pub_sub_state.pub_topics + iVar3;
    }
    iVar12 = ndn_forwarder_register_name_prefix
                       ((ndn_name_t *)&scope_name.components[9].size,_on_subscription_interest,
                        userdata);
    if (iVar12 != 0) {
      printf("ERROR: %s, L%d: ","ps_publish_command",0x2c8);
      printf("[PUB/SUB] Cannot register prefix for newly published command. Error Code: %d");
    }
    userdata->service = local_31[0];
    userdata->is_cmd = true;
  }
  nVar6 = ndn_time_now_ms();
  userdata->last_update_tp = nVar6;
  memset(userdata->cache,0,300);
  sVar7 = strlen(pcStack_40);
  if (sVar7 != 0) {
    pnVar9 = (ndn_name_t *)local_400;
    ndn_name_from_string(pnVar9,pcStack_40,(uint32_t)sVar7);
    for (uVar13 = 0; uVar13 < scope_name.components[9].value[0x20]; uVar13 = uVar13 + 1) {
      ndn_name_append_component((ndn_name_t *)&scope_name.components[9].size,pnVar9->components);
      pnVar9 = (ndn_name_t *)(pnVar9->components + 1);
    }
  }
  name_00 = &scope_name.components[9].size;
  ndn_name_append_bytes_component((ndn_name_t *)name_00,event->data_id,event->data_id_len);
  nVar6 = ndn_time_now_ms();
  puVar1 = &name.components[9].size;
  name_component_from_timestamp((name_component_t *)puVar1,nVar6);
  ndn_name_append_component((ndn_name_t *)name_00,(name_component_t *)puVar1);
  m_measure_tp1 = ndn_time_now_us();
  local_44 = 0;
  pnVar8 = ndn_ac_get_key_for_service(userdata->service);
  uVar4 = ndn_gen_encrypted_payload
                    (event->payload,event->payload_len,pkt_encoding_buf,&local_44,pnVar8->key_id,
                     (uint8_t *)0x0,0);
  if (uVar4 == 0) {
    m_measure_tp2 = ndn_time_now_us();
    printf("DEBUG: %s, L%d: ","ps_publish_command",0x2f0);
    printf("[PUB/SUB] PUB-COMMAND-DATA-AES-ENC: %lu\n",m_measure_tp2 - m_measure_tp1);
    uVar4 = event->freshness_period;
    pnVar9 = ndn_key_storage_get_self_identity(local_31[0]);
    pnVar10 = ndn_key_storage_get_self_identity_key(local_31[0]);
    if (pnVar10 == (ndn_ecc_prv_t *)0x0 || pnVar9 == (ndn_name_t *)0x0) {
      printf("ERROR: %s, L%d: ","ps_publish_command",0x2ff);
      printf("[PUB/SUB] Cannot find proper identity to sign");
    }
    else {
      uVar13 = 8000;
      if (uVar4 != 0) {
        uVar13 = (ulong)uVar4;
      }
      tlv_make_data(userdata->cache,300,(size_t *)&userdata->cache_size,7,0,
                    &scope_name.components[9].size,8,pkt_encoding_buf,9,(ulong)local_44,4,uVar13,10,
                    3,0xb,pnVar9,0xc,pnVar10);
      printf("DEBUG: %s, L%d: ","ps_publish_command",0x30a);
      printf("[PUB/SUB] PUB-CMD-PKT-SIZE: %u Bytes\n",(ulong)userdata->cache_size);
      printf("INFO: %s: ","ps_publish_command");
      printf("[PUB/SUB] CMD Data has been generated");
      putchar(10);
      puVar1 = &scope_name.components[9].size;
      ndn_name_print((ndn_name_t *)puVar1);
      ndn_name_init((ndn_name_t *)puVar1);
      ndn_name_append_component((ndn_name_t *)puVar1,(name_component_t *)stack0xffffffffffffffa8);
      ndn_name_append_bytes_component((ndn_name_t *)puVar1,local_31,1);
      ndn_name_append_string_component((ndn_name_t *)puVar1,"NOTIFY",6);
      ndn_name_append_string_component((ndn_name_t *)puVar1,"CMD",3);
      if (*pcStack_40 != '\0') {
        component = (name_component_t *)local_400;
        for (uVar13 = 0; uVar13 < scope_name.components[9].value[0x20]; uVar13 = uVar13 + 1) {
          ndn_name_append_component((ndn_name_t *)&scope_name.components[9].size,component);
          component = component + 1;
        }
      }
      puVar1 = &scope_name.components[9].size;
      ndn_name_append_bytes_component((ndn_name_t *)puVar1,event->data_id,event->data_id_len);
      ndn_name_append_component((ndn_name_t *)puVar1,(name_component_t *)&name.components[9].size);
      tp_comp.value[0x20] = '\0';
      tp_comp.value[0x21] = '\0';
      tp_comp.value[0x22] = '\0';
      tp_comp.value[0x23] = '\0';
      tlv_make_interest(pkt_encoding_buf,0x200,(size_t *)(tp_comp.value + 0x20),3,0,puVar1,3,1,4,1);
      m_is_my_own_int = 1;
      ndn_forwarder_express_interest
                (pkt_encoding_buf,(ulong)(uint)tp_comp.value._32_4_,_on_new_content,_on_sub_timeout,
                 (void *)0x0);
      m_is_my_own_int = 0;
      printf("INFO: %s: ","ps_publish_command");
      printf("[PUB/SUB] Sent notification Interest for the newly generated cmd");
      putchar(10);
      ndn_name_print((ndn_name_t *)puVar1);
    }
  }
  else {
    printf("ERROR: %s, L%d: ","ps_publish_command",0x2ea);
    printf("[PUB/SUB] Cannot encrypt command payload to publish. Error code: %d",(ulong)uVar4);
  }
  return;
}

Assistant:

void
ps_publish_command(uint8_t service, const char* scope, const ps_event_t* event)
{
  if (!m_has_initialized)
    _ps_topics_init();

  int ret = 0;
  // Prefix FORMAT: /home/service/CMD
  ndn_name_t name;
  ndn_name_init(&name);
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
  ndn_name_append_bytes_component(&name, &service, sizeof(service));
  ndn_name_append_string_component(&name, "CMD", strlen("CMD"));

  // published on this topic before? update the cache
  pub_topic_t* topic = NULL;
  topic = _match_pub_topic(service, true);
  if (!topic) {
    for (int i = 0; i < 5; i++) {
      if (m_pub_sub_state.pub_topics[i].service == NDN_SD_NONE) {
        topic = &m_pub_sub_state.pub_topics[i];
      }
    }
    if (topic == NULL) {
      NDN_LOG_INFO("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      uint64_t min_last_tp = m_pub_sub_state.pub_topics[0].last_update_tp;
      int index = -1;
      for (int i = 1; i < 5; i++) {
        if (m_pub_sub_state.pub_topics[i].last_update_tp < min_last_tp) {
          min_last_tp = m_pub_sub_state.pub_topics[i].last_update_tp;
          index = i;
        }
      }
      topic = &m_pub_sub_state.pub_topics[index];
      // TODO: unregister the prefix registered by the old topic
    }
    // register the new prefix
    ret = ndn_forwarder_register_name_prefix(&name, _on_subscription_interest, topic);
    if (ret != NDN_SUCCESS) {
      NDN_LOG_ERROR("[PUB/SUB] Cannot register prefix for newly published command. Error Code: %d", ret);
    }
    topic->service = service;
    topic->is_cmd = true;
  }
  topic->last_update_tp = ndn_time_now_ms();
  memset(topic->cache, 0, sizeof(topic->cache));

  // Append the last several component to the Data name
  // Data name FORMAT: /home/service/CMD/identifier[0,2]/command-id
  ndn_name_t scope_name;
  if (strlen(scope) > 0) {
    ndn_name_from_string(&scope_name, scope, strlen(scope));
    for (int i = 0; i < scope_name.components_size; i++) {
      ndn_name_append_component(&name, &scope_name.components[i]);
    }
  }
  ndn_name_append_bytes_component(&name, event->data_id, event->data_id_len);
  // TODO: currently I appended timestamp. Further discussion is needed.
  ndn_time_ms_t tp = ndn_time_now_ms();
  name_component_t tp_comp;
  name_component_from_timestamp(&tp_comp, tp);
  ndn_name_append_component(&name, &tp_comp);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // Encrypt payload
  uint32_t used_size = 0;
  ndn_aes_key_t* service_aes_key = ndn_ac_get_key_for_service(topic->service);
  ret = ndn_gen_encrypted_payload(event->payload, event->payload_len, pkt_encoding_buf, &used_size,
                                  service_aes_key->key_id, NULL, 0);
  if (ret != NDN_SUCCESS) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot encrypt command payload to publish. Error code: %d", ret);
    return;
  }

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[PUB/SUB] PUB-COMMAND-DATA-AES-ENC: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  uint32_t default_freshness_period = 0;
  if (!event->freshness_period) {
    // this user does not define the freshness period, it will pick 8000ms as default
    default_freshness_period = 8000;
  }
  else {
    default_freshness_period = event->freshness_period;
  }
  // select identity key
  ndn_name_t* signing_identity = ndn_key_storage_get_self_identity(service);
  ndn_ecc_prv_t* signing_identity_key = ndn_key_storage_get_self_identity_key(service);
  if (signing_identity == NULL || signing_identity_key == NULL) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot find proper identity to sign");
    return;
  }
  ret = tlv_make_data(topic->cache, sizeof(topic->cache), (size_t *) &topic->cache_size, 7,
                      TLV_DATAARG_NAME_PTR, &name,
                      TLV_DATAARG_CONTENT_BUF, pkt_encoding_buf,
                      TLV_DATAARG_CONTENT_SIZE, used_size,
                      TLV_DATAARG_FRESHNESSPERIOD_U64, (uint64_t)default_freshness_period,
                      TLV_DATAARG_SIGTYPE_U8, NDN_SIG_TYPE_ECDSA_SHA256,
                      TLV_DATAARG_IDENTITYNAME_PTR, signing_identity,
                      TLV_DATAARG_SIGKEY_PTR, signing_identity_key);
  NDN_LOG_DEBUG("[PUB/SUB] PUB-CMD-PKT-SIZE: %u Bytes\n", topic->cache_size);
  NDN_LOG_INFO("[PUB/SUB] CMD Data has been generated");
  NDN_LOG_INFO_NAME(&name);

  // express the /Notify Interest
  // FORMAT: /home/service/NOTIFY/CMD/identifier[0,2]/action
  ndn_name_init(&name);
  ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
  ndn_name_append_bytes_component(&name, &service, sizeof(service));
  ndn_name_append_string_component(&name, "NOTIFY", strlen("NOTIFY"));
  ndn_name_append_string_component(&name, "CMD", strlen("CMD"));
  if (strlen(scope) > 0) {
    for (int i = 0; i < scope_name.components_size; i++) {
      ndn_name_append_component(&name, &scope_name.components[i]);
    }
  }
  ndn_name_append_bytes_component(&name, event->data_id, event->data_id_len);
  ndn_name_append_component(&name, &tp_comp);

  // send out the notification Interest
  uint32_t buffer_length = 0;
  tlv_make_interest(pkt_encoding_buf, sizeof(pkt_encoding_buf), (size_t *) &buffer_length, 3,
                    TLV_INTARG_NAME_PTR, &name,
                    TLV_INTARG_CANBEPREFIX_BOOL, true,
                    TLV_INTARG_MUSTBEFRESH_BOOL, true);
  m_is_my_own_int = true;
  ret = ndn_forwarder_express_interest(pkt_encoding_buf, buffer_length, _on_new_content, _on_sub_timeout, NULL);
  m_is_my_own_int = false;
  NDN_LOG_INFO("[PUB/SUB] Sent notification Interest for the newly generated cmd");
  NDN_LOG_INFO_NAME(&name);
}